

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_string_compare(JSContext *ctx,JSString *p1,JSString *p2)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  int len;
  int res;
  JSString *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe4;
  
  iVar1 = min_int((uint)*(undefined8 *)(in_RSI + 4) & 0x7fffffff,
                  (uint)*(undefined8 *)(in_RDX + 4) & 0x7fffffff);
  iVar1 = js_string_memcmp((JSString *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
                           in_stack_ffffffffffffffd8,0);
  if (iVar1 == 0) {
    if (((uint)*(undefined8 *)(in_RSI + 4) & 0x7fffffff) ==
        ((uint)*(undefined8 *)(in_RDX + 4) & 0x7fffffff)) {
      iVar1 = 0;
    }
    else if (((uint)*(undefined8 *)(in_RSI + 4) & 0x7fffffff) <
             ((uint)*(undefined8 *)(in_RDX + 4) & 0x7fffffff)) {
      iVar1 = -1;
    }
    else {
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int js_string_compare(JSContext *ctx,
                             const JSString *p1, const JSString *p2)
{
    int res, len;
    len = min_int(p1->len, p2->len);
    res = js_string_memcmp(p1, p2, len);
    if (res == 0) {
        if (p1->len == p2->len)
            res = 0;
        else if (p1->len < p2->len)
            res = -1;
        else
            res = 1;
    }
    return res;
}